

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O3

ssize_t __thiscall
sznet::net::KcpConnection::send(KcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 uVar1;
  bool bVar2;
  ulong *in_RAX;
  ssize_t extraout_RAX;
  ulong *extraout_RAX_00;
  undefined4 in_register_00000034;
  long *plVar3;
  ulong *puVar4;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  code *local_90;
  undefined8 local_88;
  ulong *local_80;
  undefined8 local_78;
  ulong local_70;
  undefined8 uStack_68;
  KcpConnection *local_60;
  EventLoop *local_58;
  ulong *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    bVar2 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar2) {
      sendInLoop(this,(char *)*plVar3,(int)plVar3[1]);
      return extraout_RAX;
    }
    local_58 = this->m_loop;
    local_50 = (ulong *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,*plVar3,(long)(int)plVar3[1] + *plVar3);
    uVar1 = local_48;
    local_90 = sendInLoop;
    local_88 = 0;
    puVar4 = local_50;
    if (local_50 == (ulong *)&local_40) {
      uStack_68 = uStack_38;
      puVar4 = &local_70;
    }
    local_70 = CONCAT71(uStack_3f,local_40);
    local_48 = 0;
    local_40 = 0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    pcStack_a8 = (code *)0x0;
    pcStack_a0 = (code *)0x0;
    local_78 = uVar1;
    local_80 = puVar4;
    local_60 = this;
    local_50 = (ulong *)&local_40;
    local_b8._M_unused._M_object = operator_new(0x38);
    *(code **)local_b8._M_unused._0_8_ = sendInLoop;
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
    *(code **)((long)local_b8._M_unused._0_8_ + 0x10) =
         (code *)((long)local_b8._M_unused._0_8_ + 0x20);
    if (puVar4 == &local_70) {
      *(ulong *)((long)local_b8._M_unused._0_8_ + 0x20) = local_70;
      *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x28) = uStack_68;
    }
    else {
      *(ulong **)((long)local_b8._M_unused._0_8_ + 0x10) = puVar4;
      *(ulong *)((long)local_b8._M_unused._0_8_ + 0x20) = local_70;
    }
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x18) = uVar1;
    local_78 = 0;
    local_70 = local_70 & 0xffffffffffffff00;
    *(KcpConnection **)((long)local_b8._M_unused._0_8_ + 0x30) = this;
    pcStack_a0 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(sznet::net::KcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>_>
                 ::_M_invoke;
    pcStack_a8 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(sznet::net::KcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>_>
                 ::_M_manager;
    local_80 = &local_70;
    EventLoop::runInLoop(local_58,(Functor *)&local_b8);
    if (pcStack_a8 != (code *)0x0) {
      (*pcStack_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    in_RAX = (ulong *)&local_40;
    if (local_50 != in_RAX) {
      operator_delete(local_50);
      in_RAX = extraout_RAX_00;
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void KcpConnection::send(const StringPiece& message)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(message);
		}
		else
		{
			void (KcpConnection:: * fp)(const StringPiece & message) = &KcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, message.as_string()));
		}
	}
}